

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::appendNewNode(FormulasLoader *this,INode *node)

{
  bool bVar1;
  ArrayPrimitiveType<MathML::AST::INode_*> *in_RSI;
  INode **in_RDI;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *unaff_retaddr;
  INode **__x;
  
  if (in_RSI != (ArrayPrimitiveType<MathML::AST::INode_*> *)0x0) {
    __x = in_RDI;
    bVar1 = std::
            stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
            ::empty((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
                     *)0xb26cfc);
    if (bVar1) {
      COLLADAFW::Formula::getMathmlAsts((Formula *)in_RDI[2]);
      COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append(in_RSI,in_RDI);
    }
    else {
      std::
      stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
      ::top((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
             *)0xb26d2b);
      std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::push_back
                (unaff_retaddr,__x);
    }
  }
  return true;
}

Assistant:

bool FormulasLoader::appendNewNode( MathML::AST::INode* node )
	{
		if ( node )
		{
			if ( mNodeListStack.empty() )
				mCurrentFormula->getMathmlAsts().append( node );
			else
				mNodeListStack.top().push_back( node );
		}
		else
		{
			// TODO error handling
		}
		return true;
	}